

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O1

REF_STATUS
add_sub_tet(REF_INT n0,REF_INT n1,REF_INT n2,REF_INT n3,REF_INT *nodes,REF_DBL *metric,
           REF_DBL *total_node_volume,REF_NODE ref_node,REF_CELL ref_cell)

{
  int iVar1;
  REF_DBL *pRVar2;
  uint uVar3;
  REF_STATUS RVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  REF_DBL log_m [6];
  REF_DBL m [6];
  double local_100;
  int local_f8;
  int local_f4;
  int local_f0;
  int local_ec;
  REF_DBL local_88 [6];
  REF_DBL local_58 [7];
  
  local_f8 = nodes[(uint)n0];
  local_f4 = nodes[(uint)n1];
  local_f0 = nodes[(uint)n2];
  local_ec = nodes[(uint)n3];
  uVar3 = ref_node_tet_vol(ref_node,&local_f8,&local_100);
  if (uVar3 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0x5fa,
           "add_sub_tet",(ulong)uVar3,"vol");
    return uVar3;
  }
  pRVar2 = ref_node->real;
  RVar4 = ref_matrix_imply_m(local_58,pRVar2 + (long)local_f8 * 0xf,pRVar2 + (long)local_f4 * 0xf,
                             pRVar2 + (long)local_f0 * 0xf,pRVar2 + (long)local_ec * 0xf);
  if ((0.0 < local_100) && (RVar4 == 0)) {
    uVar3 = ref_matrix_log_m(local_58,local_88);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0x600,"add_sub_tet",(ulong)uVar3,"log");
      return uVar3;
    }
    iVar1 = ref_cell->node_per;
    if ((long)iVar1 < 1) {
      return 0;
    }
    lVar5 = 0;
    do {
      lVar6 = (long)nodes[lVar5];
      total_node_volume[lVar6] = total_node_volume[lVar6] + local_100;
      lVar7 = 0;
      do {
        metric[lVar6 * 6 + lVar7] = local_88[lVar7] * local_100 + metric[lVar6 * 6 + lVar7];
        lVar7 = lVar7 + 1;
      } while (lVar7 != 6);
      lVar5 = lVar5 + 1;
    } while (lVar5 != iVar1);
  }
  return 0;
}

Assistant:

static REF_STATUS add_sub_tet(REF_INT n0, REF_INT n1, REF_INT n2, REF_INT n3,
                              REF_INT *nodes, REF_DBL *metric,
                              REF_DBL *total_node_volume, REF_NODE ref_node,
                              REF_CELL ref_cell) {
  REF_INT tet_nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL m[6], log_m[6];
  REF_DBL tet_volume;
  REF_INT node, im;
  REF_STATUS status;
  tet_nodes[0] = nodes[(n0)];
  tet_nodes[1] = nodes[(n1)];
  tet_nodes[2] = nodes[(n2)];
  tet_nodes[3] = nodes[(n3)];
  RSS(ref_node_tet_vol(ref_node, tet_nodes, &tet_volume), "vol");
  status = ref_matrix_imply_m(m, ref_node_xyz_ptr(ref_node, tet_nodes[0]),
                              ref_node_xyz_ptr(ref_node, tet_nodes[1]),
                              ref_node_xyz_ptr(ref_node, tet_nodes[2]),
                              ref_node_xyz_ptr(ref_node, tet_nodes[3]));
  if (tet_volume > 0.0 && REF_SUCCESS == status) {
    RSS(ref_matrix_log_m(m, log_m), "log");
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      total_node_volume[nodes[node]] += tet_volume;
      for (im = 0; im < 6; im++)
        metric[im + 6 * nodes[node]] += tet_volume * log_m[im];
    }
  } else {
    /* silently skip singular contribution */
  }

  return REF_SUCCESS;
}